

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joynu.c
# Opt level: O0

_Bool al_install_joystick(void)

{
  _Bool _Var1;
  ALLEGRO_SYSTEM *es;
  ALLEGRO_JOYSTICK_DRIVER *desc;
  ALLEGRO_JOYSTICK_DRIVER *joydrv;
  ALLEGRO_SYSTEM *sysdrv;
  _Bool local_1;
  
  if (new_joystick_driver == (ALLEGRO_JOYSTICK_DRIVER *)0x0) {
    es = al_get_system_driver();
    if (es->vt->get_joystick_driver != (_func_ALLEGRO_JOYSTICK_DRIVER_ptr *)0x0) {
      desc = (*es->vt->get_joystick_driver)();
      _al_event_source_init((ALLEGRO_EVENT_SOURCE *)es);
      if ((desc != (ALLEGRO_JOYSTICK_DRIVER *)0x0) && (_Var1 = (*desc->init_joystick)(), _Var1)) {
        new_joystick_driver = desc;
        _al_add_exit_func((_func_void *)es,(char *)desc);
        return true;
      }
      _al_event_source_free((ALLEGRO_EVENT_SOURCE *)es);
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool al_install_joystick(void)
{
   ALLEGRO_SYSTEM *sysdrv;
   ALLEGRO_JOYSTICK_DRIVER *joydrv;

   if (new_joystick_driver)
      return true;

   sysdrv = al_get_system_driver();
   ASSERT(sysdrv);

   /* Currently every platform only has at most one joystick driver. */
   if (sysdrv->vt->get_joystick_driver) {
      joydrv = sysdrv->vt->get_joystick_driver();
      /* Avoid race condition in case the joystick driver generates an
       * event right after ->init_joystick.
       */
      _al_event_source_init(&es);
      if (joydrv && joydrv->init_joystick()) {
         new_joystick_driver = joydrv;
         _al_add_exit_func(al_uninstall_joystick, "al_uninstall_joystick");
         return true;
      }
      _al_event_source_free(&es);
   }

   return false;
}